

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signature.c
# Opt level: O0

int EVP_PKEY_sign(EVP_PKEY_CTX *ctx,uchar *sig,size_t *siglen,uchar *tbs,size_t tbslen)

{
  int iVar1;
  ulong uVar2;
  size_t pksize;
  int ret;
  size_t local_68;
  EVP_PKEY *in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffa8;
  int line;
  char *in_stack_ffffffffffffffb0;
  int local_4;
  
  line = (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  if (ctx == (EVP_PKEY_CTX *)0x0) {
    ERR_new();
    ERR_set_debug(in_stack_ffffffffffffffb0,line,(char *)in_stack_ffffffffffffffa0);
    ERR_set_error(6,0x96,(char *)0x0);
    local_4 = -2;
  }
  else if (*(int *)ctx == 0x10) {
    if (*(long *)(ctx + 0x30) == 0) {
      if ((*(long *)(ctx + 0x78) == 0) || (*(long *)(*(long *)(ctx + 0x78) + 0x48) == 0)) {
        ERR_new();
        ERR_set_debug(in_stack_ffffffffffffffb0,line,(char *)in_stack_ffffffffffffffa0);
        ERR_set_error(6,0x96,(char *)0x0);
        local_4 = -2;
      }
      else {
        if ((*(uint *)(*(long *)(ctx + 0x78) + 4) & 2) != 0) {
          iVar1 = EVP_PKEY_get_size(in_stack_ffffffffffffffa0);
          uVar2 = (ulong)iVar1;
          if (uVar2 == 0) {
            ERR_new();
            ERR_set_debug(in_stack_ffffffffffffffb0,line,(char *)in_stack_ffffffffffffffa0);
            ERR_set_error(6,0xa3,(char *)0x0);
            return 0;
          }
          if (sig == (uchar *)0x0) {
            *siglen = uVar2;
            return 1;
          }
          if (*siglen < uVar2) {
            ERR_new();
            ERR_set_debug(in_stack_ffffffffffffffb0,line,(char *)in_stack_ffffffffffffffa0);
            ERR_set_error(6,0x9b,(char *)0x0);
            return 0;
          }
        }
        local_4 = (**(code **)(*(long *)(ctx + 0x78) + 0x48))(ctx,sig,siglen,tbs,tbslen);
      }
    }
    else {
      if (sig == (uchar *)0x0) {
        local_68 = 0;
      }
      else {
        local_68 = *siglen;
      }
      local_4 = (**(code **)(*(long *)(ctx + 0x28) + 0x40))
                          (*(undefined8 *)(ctx + 0x30),sig,siglen,local_68,tbs,tbslen);
    }
  }
  else {
    ERR_new();
    ERR_set_debug(in_stack_ffffffffffffffb0,line,(char *)in_stack_ffffffffffffffa0);
    ERR_set_error(6,0x97,(char *)0x0);
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int EVP_PKEY_sign(EVP_PKEY_CTX *ctx,
                  unsigned char *sig, size_t *siglen,
                  const unsigned char *tbs, size_t tbslen)
{
    int ret;

    if (ctx == NULL) {
        ERR_raise(ERR_LIB_EVP, EVP_R_OPERATION_NOT_SUPPORTED_FOR_THIS_KEYTYPE);
        return -2;
    }

    if (ctx->operation != EVP_PKEY_OP_SIGN) {
        ERR_raise(ERR_LIB_EVP, EVP_R_OPERATION_NOT_INITIALIZED);
        return -1;
    }

    if (ctx->op.sig.algctx == NULL)
        goto legacy;

    ret = ctx->op.sig.signature->sign(ctx->op.sig.algctx, sig, siglen,
                                      (sig == NULL) ? 0 : *siglen, tbs, tbslen);

    return ret;
 legacy:

    if (ctx->pmeth == NULL || ctx->pmeth->sign == NULL) {
        ERR_raise(ERR_LIB_EVP, EVP_R_OPERATION_NOT_SUPPORTED_FOR_THIS_KEYTYPE);
        return -2;
    }

    M_check_autoarg(ctx, sig, siglen, EVP_F_EVP_PKEY_SIGN)
        return ctx->pmeth->sign(ctx, sig, siglen, tbs, tbslen);
}